

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<const_QWidget_*,_QHashDummyValue>_>::addStorage
          (Span<QHashPrivate::Node<const_QWidget_*,_QHashDummyValue>_> *this)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Entry *__dest;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar39;
  undefined1 auVar37 [16];
  int iVar40;
  undefined1 auVar38 [16];
  int iVar41;
  int iVar52;
  int iVar53;
  int iVar54;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  int iVar65;
  undefined1 auVar64 [16];
  int iVar66;
  long lVar67;
  long lVar75;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  long lVar76;
  long lVar77;
  
  bVar1 = this->allocated;
  uVar12 = (ulong)bVar1;
  if (bVar1 == 0x30) {
    __dest = (Entry *)operator_new__(0x280);
    lVar13 = 0x50;
    uVar12 = 0x30;
  }
  else {
    if (bVar1 == 0) {
      __dest = (Entry *)operator_new__(0x180);
      lVar13 = 0x30;
      uVar12 = 0;
      goto LAB_0037e906;
    }
    lVar13 = uVar12 + 0x10;
    __dest = (Entry *)operator_new__((ulong)(uint)((int)lVar13 * 8));
  }
  memcpy(__dest,this->entries,(ulong)(uint)((int)uVar12 * 8));
LAB_0037e906:
  lVar67 = uVar12 + 0xe;
  lVar75 = uVar12 + 0xf;
  lVar25 = uVar12 + 0xc;
  lVar26 = uVar12 + 0xd;
  lVar27 = uVar12 + 10;
  lVar28 = uVar12 + 0xb;
  lVar29 = uVar12 + 8;
  lVar30 = uVar12 + 9;
  lVar31 = uVar12 + 6;
  lVar32 = uVar12 + 7;
  lVar33 = uVar12 + 4;
  lVar34 = uVar12 + 5;
  lVar76 = uVar12 + 2;
  lVar77 = uVar12 + 3;
  lVar15 = uVar12 + 1;
  lVar10 = (lVar13 - uVar12) + -1;
  auVar16._8_4_ = (int)lVar10;
  auVar16._0_8_ = lVar10;
  auVar16._12_4_ = (int)((ulong)lVar10 >> 0x20);
  uVar11 = 0;
  uVar14 = uVar12;
  do {
    auVar64._8_4_ = (int)uVar11;
    auVar64._0_8_ = uVar11;
    auVar64._12_4_ = (int)(uVar11 >> 0x20);
    auVar37 = auVar16 ^ _DAT_00660670;
    auVar35 = (auVar64 | _DAT_00660660) ^ _DAT_00660670;
    iVar65 = auVar37._0_4_;
    iVar41 = -(uint)(iVar65 < auVar35._0_4_);
    iVar66 = auVar37._4_4_;
    iVar52 = -(uint)(iVar66 < auVar35._4_4_);
    iVar39 = auVar37._8_4_;
    iVar53 = -(uint)(iVar39 < auVar35._8_4_);
    iVar40 = auVar37._12_4_;
    iVar54 = -(uint)(iVar40 < auVar35._12_4_);
    auVar68._4_4_ = iVar41;
    auVar68._0_4_ = iVar41;
    auVar68._8_4_ = iVar53;
    auVar68._12_4_ = iVar53;
    auVar60 = pshuflw(in_XMM12,auVar68,0xe8);
    auVar42._4_4_ = -(uint)(auVar35._4_4_ == iVar66);
    auVar42._12_4_ = -(uint)(auVar35._12_4_ == iVar40);
    auVar42._0_4_ = auVar42._4_4_;
    auVar42._8_4_ = auVar42._12_4_;
    auVar55 = pshuflw(in_XMM10,auVar42,0xe8);
    auVar36._4_4_ = iVar52;
    auVar36._0_4_ = iVar52;
    auVar36._8_4_ = iVar54;
    auVar36._12_4_ = iVar54;
    auVar37 = pshuflw(_DAT_00660670,auVar36,0xe8);
    auVar35._8_4_ = 0xffffffff;
    auVar35._0_8_ = 0xffffffffffffffff;
    auVar35._12_4_ = 0xffffffff;
    auVar35 = (auVar37 | auVar55 & auVar60) ^ auVar35;
    auVar35 = packssdw(auVar35,auVar35);
    if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      __dest[uVar12 + uVar11].storage.data[0] = (char)uVar14 + '\x01';
    }
    auVar36 = auVar42 & auVar68 | auVar36;
    auVar35 = packssdw(auVar36,auVar36);
    auVar37._8_4_ = 0xffffffff;
    auVar37._0_8_ = 0xffffffffffffffff;
    auVar37._12_4_ = 0xffffffff;
    auVar35 = packssdw(auVar35 ^ auVar37,auVar35 ^ auVar37);
    auVar35 = packsswb(auVar35,auVar35);
    if ((auVar35._0_4_ >> 8 & 1) != 0) {
      __dest[uVar12 + uVar11 + 1].storage.data[0] = (char)lVar15 + '\x01';
    }
    auVar35 = (auVar64 | _DAT_00660650) ^ _DAT_00660670;
    iVar41 = -(uint)(iVar65 < auVar35._0_4_);
    iVar53 = -(uint)(iVar66 < auVar35._4_4_);
    iVar52 = -(uint)(iVar39 < auVar35._8_4_);
    iVar54 = -(uint)(iVar40 < auVar35._12_4_);
    auVar60._4_4_ = iVar41;
    auVar60._0_4_ = iVar41;
    auVar60._8_4_ = iVar52;
    auVar60._12_4_ = iVar52;
    iVar41 = -(uint)(auVar35._4_4_ == iVar66);
    iVar52 = -(uint)(auVar35._12_4_ == iVar40);
    auVar69._4_4_ = iVar41;
    auVar69._0_4_ = iVar41;
    auVar69._8_4_ = iVar52;
    auVar69._12_4_ = iVar52;
    auVar61._4_4_ = iVar53;
    auVar61._0_4_ = iVar53;
    auVar61._8_4_ = iVar54;
    auVar61._12_4_ = iVar54;
    auVar35 = auVar69 & auVar60 | auVar61;
    auVar35 = packssdw(auVar35,auVar35);
    auVar55._8_4_ = 0xffffffff;
    auVar55._0_8_ = 0xffffffffffffffff;
    auVar55._12_4_ = 0xffffffff;
    auVar35 = packssdw(auVar35 ^ auVar55,auVar35 ^ auVar55);
    auVar35 = packsswb(auVar35,auVar35);
    if ((auVar35._0_4_ >> 0x10 & 1) != 0) {
      __dest[uVar12 + uVar11 + 2].storage.data[0] = (char)lVar76 + '\x01';
    }
    auVar35 = pshufhw(auVar35,auVar60,0x84);
    auVar42 = pshufhw(auVar60,auVar69,0x84);
    auVar37 = pshufhw(auVar35,auVar61,0x84);
    auVar17._8_4_ = 0xffffffff;
    auVar17._0_8_ = 0xffffffffffffffff;
    auVar17._12_4_ = 0xffffffff;
    auVar17 = (auVar37 | auVar42 & auVar35) ^ auVar17;
    auVar35 = packssdw(auVar17,auVar17);
    auVar35 = packsswb(auVar35,auVar35);
    if ((auVar35._0_4_ >> 0x18 & 1) != 0) {
      __dest[uVar12 + uVar11 + 3].storage.data[0] = (char)lVar77 + '\x01';
    }
    auVar35 = (auVar64 | _DAT_00660640) ^ _DAT_00660670;
    auVar56._0_4_ = -(uint)(iVar65 < auVar35._0_4_);
    auVar56._4_4_ = -(uint)(iVar66 < auVar35._4_4_);
    auVar56._8_4_ = -(uint)(iVar39 < auVar35._8_4_);
    auVar56._12_4_ = -(uint)(iVar40 < auVar35._12_4_);
    auVar70._4_4_ = auVar56._0_4_;
    auVar70._0_4_ = auVar56._0_4_;
    auVar70._8_4_ = auVar56._8_4_;
    auVar70._12_4_ = auVar56._8_4_;
    auVar42 = pshuflw(auVar61,auVar70,0xe8);
    auVar18._0_4_ = -(uint)(auVar35._0_4_ == iVar65);
    auVar18._4_4_ = -(uint)(auVar35._4_4_ == iVar66);
    auVar18._8_4_ = -(uint)(auVar35._8_4_ == iVar39);
    auVar18._12_4_ = -(uint)(auVar35._12_4_ == iVar40);
    auVar43._4_4_ = auVar18._4_4_;
    auVar43._0_4_ = auVar18._4_4_;
    auVar43._8_4_ = auVar18._12_4_;
    auVar43._12_4_ = auVar18._12_4_;
    auVar35 = pshuflw(auVar18,auVar43,0xe8);
    auVar44._4_4_ = auVar56._4_4_;
    auVar44._0_4_ = auVar56._4_4_;
    auVar44._8_4_ = auVar56._12_4_;
    auVar44._12_4_ = auVar56._12_4_;
    auVar37 = pshuflw(auVar56,auVar44,0xe8);
    auVar2._8_4_ = 0xffffffff;
    auVar2._0_8_ = 0xffffffffffffffff;
    auVar2._12_4_ = 0xffffffff;
    auVar35 = packssdw(auVar35 & auVar42,(auVar37 | auVar35 & auVar42) ^ auVar2);
    auVar35 = packsswb(auVar35,auVar35);
    if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      __dest[uVar12 + uVar11 + 4].storage.data[0] = (char)lVar33 + '\x01';
    }
    auVar44 = auVar43 & auVar70 | auVar44;
    auVar37 = packssdw(auVar44,auVar44);
    auVar3._8_4_ = 0xffffffff;
    auVar3._0_8_ = 0xffffffffffffffff;
    auVar3._12_4_ = 0xffffffff;
    auVar35 = packssdw(auVar35,auVar37 ^ auVar3);
    auVar35 = packsswb(auVar35,auVar35);
    if ((auVar35._4_2_ >> 8 & 1) != 0) {
      __dest[uVar12 + uVar11 + 5].storage.data[0] = (char)lVar34 + '\x01';
    }
    auVar35 = (auVar64 | _DAT_00660630) ^ _DAT_00660670;
    iVar41 = -(uint)(iVar65 < auVar35._0_4_);
    iVar53 = -(uint)(iVar66 < auVar35._4_4_);
    iVar52 = -(uint)(iVar39 < auVar35._8_4_);
    iVar54 = -(uint)(iVar40 < auVar35._12_4_);
    auVar45._4_4_ = iVar41;
    auVar45._0_4_ = iVar41;
    auVar45._8_4_ = iVar52;
    auVar45._12_4_ = iVar52;
    iVar41 = -(uint)(auVar35._4_4_ == iVar66);
    iVar52 = -(uint)(auVar35._12_4_ == iVar40);
    auVar62._4_4_ = iVar41;
    auVar62._0_4_ = iVar41;
    auVar62._8_4_ = iVar52;
    auVar62._12_4_ = iVar52;
    auVar71._4_4_ = iVar53;
    auVar71._0_4_ = iVar53;
    auVar71._8_4_ = iVar54;
    auVar71._12_4_ = iVar54;
    auVar35 = auVar62 & auVar45 | auVar71;
    auVar35 = packssdw(auVar35,auVar35);
    auVar4._8_4_ = 0xffffffff;
    auVar4._0_8_ = 0xffffffffffffffff;
    auVar4._12_4_ = 0xffffffff;
    auVar35 = packssdw(auVar35 ^ auVar4,auVar35 ^ auVar4);
    auVar35 = packsswb(auVar35,auVar35);
    if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      __dest[uVar12 + uVar11 + 6].storage.data[0] = (char)lVar31 + '\x01';
    }
    auVar35 = pshufhw(auVar35,auVar45,0x84);
    auVar42 = pshufhw(auVar45,auVar62,0x84);
    auVar37 = pshufhw(auVar35,auVar71,0x84);
    auVar19._8_4_ = 0xffffffff;
    auVar19._0_8_ = 0xffffffffffffffff;
    auVar19._12_4_ = 0xffffffff;
    auVar19 = (auVar37 | auVar42 & auVar35) ^ auVar19;
    auVar35 = packssdw(auVar19,auVar19);
    auVar35 = packsswb(auVar35,auVar35);
    if ((auVar35._6_2_ >> 8 & 1) != 0) {
      __dest[uVar12 + uVar11 + 7].storage.data[0] = (char)lVar32 + '\x01';
    }
    auVar35 = (auVar64 | _DAT_00660620) ^ _DAT_00660670;
    auVar57._0_4_ = -(uint)(iVar65 < auVar35._0_4_);
    auVar57._4_4_ = -(uint)(iVar66 < auVar35._4_4_);
    auVar57._8_4_ = -(uint)(iVar39 < auVar35._8_4_);
    auVar57._12_4_ = -(uint)(iVar40 < auVar35._12_4_);
    auVar72._4_4_ = auVar57._0_4_;
    auVar72._0_4_ = auVar57._0_4_;
    auVar72._8_4_ = auVar57._8_4_;
    auVar72._12_4_ = auVar57._8_4_;
    auVar42 = pshuflw(auVar62,auVar72,0xe8);
    auVar20._0_4_ = -(uint)(auVar35._0_4_ == iVar65);
    auVar20._4_4_ = -(uint)(auVar35._4_4_ == iVar66);
    auVar20._8_4_ = -(uint)(auVar35._8_4_ == iVar39);
    auVar20._12_4_ = -(uint)(auVar35._12_4_ == iVar40);
    auVar46._4_4_ = auVar20._4_4_;
    auVar46._0_4_ = auVar20._4_4_;
    auVar46._8_4_ = auVar20._12_4_;
    auVar46._12_4_ = auVar20._12_4_;
    auVar35 = pshuflw(auVar20,auVar46,0xe8);
    auVar47._4_4_ = auVar57._4_4_;
    auVar47._0_4_ = auVar57._4_4_;
    auVar47._8_4_ = auVar57._12_4_;
    auVar47._12_4_ = auVar57._12_4_;
    auVar37 = pshuflw(auVar57,auVar47,0xe8);
    auVar58._8_4_ = 0xffffffff;
    auVar58._0_8_ = 0xffffffffffffffff;
    auVar58._12_4_ = 0xffffffff;
    auVar58 = (auVar37 | auVar35 & auVar42) ^ auVar58;
    auVar37 = packssdw(auVar58,auVar58);
    auVar35 = packsswb(auVar35 & auVar42,auVar37);
    if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      __dest[uVar12 + uVar11 + 8].storage.data[0] = (char)lVar29 + '\x01';
    }
    auVar47 = auVar46 & auVar72 | auVar47;
    auVar37 = packssdw(auVar47,auVar47);
    auVar5._8_4_ = 0xffffffff;
    auVar5._0_8_ = 0xffffffffffffffff;
    auVar5._12_4_ = 0xffffffff;
    auVar37 = packssdw(auVar37 ^ auVar5,auVar37 ^ auVar5);
    auVar35 = packsswb(auVar35,auVar37);
    if ((auVar35._8_2_ >> 8 & 1) != 0) {
      __dest[uVar12 + uVar11 + 9].storage.data[0] = (char)lVar30 + '\x01';
    }
    auVar35 = (auVar64 | _DAT_00660610) ^ _DAT_00660670;
    iVar41 = -(uint)(iVar65 < auVar35._0_4_);
    iVar53 = -(uint)(iVar66 < auVar35._4_4_);
    iVar52 = -(uint)(iVar39 < auVar35._8_4_);
    iVar54 = -(uint)(iVar40 < auVar35._12_4_);
    auVar48._4_4_ = iVar41;
    auVar48._0_4_ = iVar41;
    auVar48._8_4_ = iVar52;
    auVar48._12_4_ = iVar52;
    iVar41 = -(uint)(auVar35._4_4_ == iVar66);
    iVar52 = -(uint)(auVar35._12_4_ == iVar40);
    auVar63._4_4_ = iVar41;
    auVar63._0_4_ = iVar41;
    auVar63._8_4_ = iVar52;
    auVar63._12_4_ = iVar52;
    auVar73._4_4_ = iVar53;
    auVar73._0_4_ = iVar53;
    auVar73._8_4_ = iVar54;
    auVar73._12_4_ = iVar54;
    auVar35 = auVar63 & auVar48 | auVar73;
    auVar35 = packssdw(auVar35,auVar35);
    auVar6._8_4_ = 0xffffffff;
    auVar6._0_8_ = 0xffffffffffffffff;
    auVar6._12_4_ = 0xffffffff;
    auVar35 = packssdw(auVar35 ^ auVar6,auVar35 ^ auVar6);
    auVar35 = packsswb(auVar35,auVar35);
    if ((auVar35 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
      __dest[uVar12 + uVar11 + 10].storage.data[0] = (char)lVar27 + '\x01';
    }
    auVar35 = pshufhw(auVar35,auVar48,0x84);
    auVar42 = pshufhw(auVar48,auVar63,0x84);
    auVar37 = pshufhw(auVar35,auVar73,0x84);
    auVar21._8_4_ = 0xffffffff;
    auVar21._0_8_ = 0xffffffffffffffff;
    auVar21._12_4_ = 0xffffffff;
    auVar21 = (auVar37 | auVar42 & auVar35) ^ auVar21;
    auVar35 = packssdw(auVar21,auVar21);
    auVar35 = packsswb(auVar35,auVar35);
    if ((auVar35._10_2_ >> 8 & 1) != 0) {
      __dest[uVar12 + uVar11 + 0xb].storage.data[0] = (char)lVar28 + '\x01';
    }
    auVar35 = (auVar64 | _DAT_00660600) ^ _DAT_00660670;
    auVar59._0_4_ = -(uint)(iVar65 < auVar35._0_4_);
    auVar59._4_4_ = -(uint)(iVar66 < auVar35._4_4_);
    auVar59._8_4_ = -(uint)(iVar39 < auVar35._8_4_);
    auVar59._12_4_ = -(uint)(iVar40 < auVar35._12_4_);
    auVar74._4_4_ = auVar59._0_4_;
    auVar74._0_4_ = auVar59._0_4_;
    auVar74._8_4_ = auVar59._8_4_;
    auVar74._12_4_ = auVar59._8_4_;
    auVar42 = pshuflw(auVar63,auVar74,0xe8);
    auVar22._0_4_ = -(uint)(auVar35._0_4_ == iVar65);
    auVar22._4_4_ = -(uint)(auVar35._4_4_ == iVar66);
    auVar22._8_4_ = -(uint)(auVar35._8_4_ == iVar39);
    auVar22._12_4_ = -(uint)(auVar35._12_4_ == iVar40);
    auVar49._4_4_ = auVar22._4_4_;
    auVar49._0_4_ = auVar22._4_4_;
    auVar49._8_4_ = auVar22._12_4_;
    auVar49._12_4_ = auVar22._12_4_;
    auVar35 = pshuflw(auVar22,auVar49,0xe8);
    auVar50._4_4_ = auVar59._4_4_;
    auVar50._0_4_ = auVar59._4_4_;
    auVar50._8_4_ = auVar59._12_4_;
    auVar50._12_4_ = auVar59._12_4_;
    auVar37 = pshuflw(auVar59,auVar50,0xe8);
    auVar7._8_4_ = 0xffffffff;
    auVar7._0_8_ = 0xffffffffffffffff;
    auVar7._12_4_ = 0xffffffff;
    auVar35 = packssdw(auVar35 & auVar42,(auVar37 | auVar35 & auVar42) ^ auVar7);
    auVar35 = packsswb(auVar35,auVar35);
    if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
      __dest[uVar12 + uVar11 + 0xc].storage.data[0] = (char)lVar25 + '\x01';
    }
    auVar50 = auVar49 & auVar74 | auVar50;
    auVar37 = packssdw(auVar50,auVar50);
    auVar8._8_4_ = 0xffffffff;
    auVar8._0_8_ = 0xffffffffffffffff;
    auVar8._12_4_ = 0xffffffff;
    auVar35 = packssdw(auVar35,auVar37 ^ auVar8);
    auVar35 = packsswb(auVar35,auVar35);
    if ((auVar35._12_2_ >> 8 & 1) != 0) {
      __dest[uVar12 + uVar11 + 0xd].storage.data[0] = (char)lVar26 + '\x01';
    }
    auVar35 = (auVar64 | _DAT_006605f0) ^ _DAT_00660670;
    auVar23._0_4_ = -(uint)(iVar65 < auVar35._0_4_);
    auVar23._4_4_ = -(uint)(iVar66 < auVar35._4_4_);
    auVar23._8_4_ = -(uint)(iVar39 < auVar35._8_4_);
    auVar23._12_4_ = -(uint)(iVar40 < auVar35._12_4_);
    auVar51._4_4_ = auVar23._0_4_;
    auVar51._0_4_ = auVar23._0_4_;
    auVar51._8_4_ = auVar23._8_4_;
    auVar51._12_4_ = auVar23._8_4_;
    iVar65 = -(uint)(auVar35._4_4_ == iVar66);
    iVar66 = -(uint)(auVar35._12_4_ == iVar40);
    auVar38._4_4_ = iVar65;
    auVar38._0_4_ = iVar65;
    auVar38._8_4_ = iVar66;
    auVar38._12_4_ = iVar66;
    in_XMM12._4_4_ = auVar23._4_4_;
    in_XMM12._0_4_ = auVar23._4_4_;
    in_XMM12._8_4_ = auVar23._12_4_;
    in_XMM12._12_4_ = auVar23._12_4_;
    in_XMM10 = auVar38 & auVar51 | in_XMM12;
    auVar35 = packssdw(auVar23,in_XMM10);
    auVar9._8_4_ = 0xffffffff;
    auVar9._0_8_ = 0xffffffffffffffff;
    auVar9._12_4_ = 0xffffffff;
    auVar35 = packssdw(auVar35 ^ auVar9,auVar35 ^ auVar9);
    auVar35 = packsswb(auVar35,auVar35);
    if ((auVar35 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
      __dest[uVar12 + uVar11 + 0xe].storage.data[0] = (char)lVar67 + '\x01';
    }
    auVar35 = pshufhw(auVar35,auVar51,0x84);
    auVar42 = pshufhw(auVar38,auVar38,0x84);
    auVar37 = pshufhw(auVar35,in_XMM12,0x84);
    auVar24._8_4_ = 0xffffffff;
    auVar24._0_8_ = 0xffffffffffffffff;
    auVar24._12_4_ = 0xffffffff;
    auVar24 = (auVar37 | auVar42 & auVar35) ^ auVar24;
    auVar35 = packssdw(auVar24,auVar24);
    auVar35 = packsswb(auVar35,auVar35);
    if ((auVar35._14_2_ >> 8 & 1) != 0) {
      __dest[uVar12 + uVar11 + 0xf].storage.data[0] = (char)lVar75 + '\x01';
    }
    uVar11 = uVar11 + 0x10;
    uVar14 = uVar14 + 0x10;
    lVar15 = lVar15 + 0x10;
    lVar76 = lVar76 + 0x10;
    lVar77 = lVar77 + 0x10;
    lVar33 = lVar33 + 0x10;
    lVar34 = lVar34 + 0x10;
    lVar31 = lVar31 + 0x10;
    lVar32 = lVar32 + 0x10;
    lVar29 = lVar29 + 0x10;
    lVar30 = lVar30 + 0x10;
    lVar27 = lVar27 + 0x10;
    lVar28 = lVar28 + 0x10;
    lVar25 = lVar25 + 0x10;
    lVar26 = lVar26 + 0x10;
    lVar67 = lVar67 + 0x10;
    lVar75 = lVar75 + 0x10;
  } while (((lVar13 - uVar12) + 0xf & 0xfffffffffffffff0) != uVar11);
  if (this->entries != (Entry *)0x0) {
    operator_delete__(this->entries);
  }
  this->entries = __dest;
  this->allocated = (uchar)lVar13;
  return;
}

Assistant:

void addStorage()
    {
        Q_ASSERT(allocated < SpanConstants::NEntries);
        Q_ASSERT(nextFree == allocated);
        // the hash table should always be between 25 and 50% full
        // this implies that we on average have between 32 and 64 entries
        // in here. More exactly, we have a binominal distribution of the amount of
        // occupied entries.
        // For a 25% filled table, the average is 32 entries, with a 95% chance that we have between
        // 23 and 41 entries.
        // For a 50% filled table, the average is 64 entries, with a 95% chance that we have between
        // 53 and 75 entries.
        // Since we only resize the table once it's 50% filled and we want to avoid copies of
        // data where possible, we initially allocate 48 entries, then resize to 80 entries, after that
        // resize by increments of 16. That way, we usually only get one resize of the table
        // while filling it.
        size_t alloc;
        static_assert(SpanConstants::NEntries % 8 == 0);
        if (!allocated)
            alloc = SpanConstants::NEntries / 8 * 3;
        else if (allocated == SpanConstants::NEntries / 8 * 3)
            alloc = SpanConstants::NEntries / 8 * 5;
        else
            alloc = allocated + SpanConstants::NEntries/8;
        Entry *newEntries = new Entry[alloc];
        // we only add storage if the previous storage was fully filled, so
        // simply copy the old data over
        if constexpr (isRelocatable<Node>()) {
            if (allocated)
                memcpy(newEntries, entries, allocated * sizeof(Entry));
        } else {
            for (size_t i = 0; i < allocated; ++i) {
                new (&newEntries[i].node()) Node(std::move(entries[i].node()));
                entries[i].node().~Node();
            }
        }
        for (size_t i = allocated; i < alloc; ++i) {
            newEntries[i].nextFree() = uchar(i + 1);
        }
        delete[] entries;
        entries = newEntries;
        allocated = uchar(alloc);
    }